

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2cirs.cpp
# Opt level: O1

void PrintResults(CEExecOptions *inputs,CESkyCoord *results)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CEAngle aCStack_68 [16];
  string local_58 [2];
  
  putchar(10);
  puts("******************************************");
  puts("* Results of Galactic -> CIRS conversion *");
  puts("******************************************");
  puts("CIRS Coordinates (output)");
  CEDate::CEDate((CEDate *)local_58,2451545.0,JD);
  (**(code **)(*(long *)results + 0x18))(aCStack_68,results,local_58);
  CEAngle::Deg();
  printf("    Right Ascension: %f degrees\n");
  CEAngle::~CEAngle(aCStack_68);
  CEDate::~CEDate((CEDate *)local_58);
  CEDate::CEDate((CEDate *)local_58,2451545.0,JD);
  (**(code **)(*(long *)results + 0x20))(aCStack_68,results,local_58);
  CEAngle::Deg();
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(aCStack_68);
  CEDate::~CEDate((CEDate *)local_58);
  puts("Galactic Coordinates (input)");
  paVar1 = &local_58[0].field_2;
  local_58[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"glon","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_58);
  printf("    Galactic Lon.  : %f degrees\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_58[0]._M_dataplus._M_p);
  }
  local_58[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"glat","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_58);
  printf("    Galactic Lat.  : %+f degrees\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_58[0]._M_dataplus._M_p);
  }
  local_58[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"juliandate","");
  CLOptions::AsDouble(&inputs->super_CLOptions,local_58);
  printf("    Julian Date    : %f\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_58[0]._M_dataplus._M_p);
  }
  putchar(10);
  return;
}

Assistant:

void PrintResults(CEExecOptions&    inputs, 
                  const CESkyCoord& results)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of Galactic -> CIRS conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("CIRS Coordinates (output)\n") ;
    std::printf("    Right Ascension: %f degrees\n", results.XCoord().Deg());
    std::printf("    Declination    : %+f degrees\n", results.YCoord().Deg());
    std::printf("Galactic Coordinates (input)\n");
    std::printf("    Galactic Lon.  : %f degrees\n", inputs.AsDouble("glon"));
    std::printf("    Galactic Lat.  : %+f degrees\n", inputs.AsDouble("glat"));
    std::printf("    Julian Date    : %f\n", inputs.AsDouble("juliandate"));
    std::printf("\n");
}